

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_cwksp.h
# Opt level: O0

void * ZSTD_cwksp_reserve_internal(ZSTD_cwksp *ws,size_t bytes,ZSTD_cwksp_alloc_phase_e phase)

{
  uint uVar1;
  size_t code;
  void *alloc;
  ZSTD_cwksp_alloc_phase_e phase_local;
  size_t bytes_local;
  ZSTD_cwksp *ws_local;
  
  code = ZSTD_cwksp_internal_advance_phase(ws,phase);
  uVar1 = ERR_isError(code);
  if ((uVar1 == 0) && (bytes != 0)) {
    ws_local = (ZSTD_cwksp *)ZSTD_cwksp_reserve_internal_buffer_space(ws,bytes);
  }
  else {
    ws_local = (ZSTD_cwksp *)0x0;
  }
  return ws_local;
}

Assistant:

MEM_STATIC void* ZSTD_cwksp_reserve_internal(
        ZSTD_cwksp* ws, size_t bytes, ZSTD_cwksp_alloc_phase_e phase) {
    void* alloc;
    if (ZSTD_isError(ZSTD_cwksp_internal_advance_phase(ws, phase)) || bytes == 0) {
        return NULL;
    }

#if ZSTD_ADDRESS_SANITIZER && !defined (ZSTD_ASAN_DONT_POISON_WORKSPACE)
    /* over-reserve space */
    bytes += 2 * ZSTD_CWKSP_ASAN_REDZONE_SIZE;
#endif

    alloc = ZSTD_cwksp_reserve_internal_buffer_space(ws, bytes);

#if ZSTD_ADDRESS_SANITIZER && !defined (ZSTD_ASAN_DONT_POISON_WORKSPACE)
    /* Move alloc so there's ZSTD_CWKSP_ASAN_REDZONE_SIZE unused space on
     * either size. */
    if (alloc) {
        alloc = (BYTE *)alloc + ZSTD_CWKSP_ASAN_REDZONE_SIZE;
        if (ws->isStatic == ZSTD_cwksp_dynamic_alloc) {
            __asan_unpoison_memory_region(alloc, bytes);
        }
    }
#endif

    return alloc;
}